

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.hpp
# Opt level: O1

void __thiscall peach::interpreter::Interpreter::popIndentation(Interpreter *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Elt_pointer pUVar3;
  shared_ptr<peach::expression::Expression> local_40;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pUVar3 = (this->unfinishedExpressions_).c.
           super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pUVar3 == (this->unfinishedExpressions_).c.
                super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pUVar3 = (this->unfinishedExpressions_).c.
             super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
  }
  peVar1 = pUVar3[-1].expression.
           super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = pUVar3[-1].expression.
            super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pUVar3 = (this->unfinishedExpressions_).c.
           super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pUVar3 == (this->unfinishedExpressions_).c.
                super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pUVar3 = (this->unfinishedExpressions_).c.
             super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
  }
  local_30 = pUVar3[-1].sequence.
             super___shared_ptr<peach::expression::ExpressionSequence,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_28 = pUVar3[-1].sequence.
             super___shared_ptr<peach::expression::ExpressionSequence,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_Expression[1])(peVar1,&local_30);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  std::
  deque<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
  ::pop_back(&(this->unfinishedExpressions_).c);
  pUVar3 = (this->unfinishedExpressions_).c.
           super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pUVar3 == (this->unfinishedExpressions_).c.
                super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pUVar3 = (this->unfinishedExpressions_).c.
             super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
  }
  peVar2 = pUVar3[-1].sequence.
           super___shared_ptr<peach::expression::ExpressionSequence,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_40.super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  local_40.super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = this_00;
  std::
  vector<std::shared_ptr<peach::expression::Expression>,std::allocator<std::shared_ptr<peach::expression::Expression>>>
  ::emplace_back<std::shared_ptr<peach::expression::Expression>>
            ((vector<std::shared_ptr<peach::expression::Expression>,std::allocator<std::shared_ptr<peach::expression::Expression>>>
              *)&peVar2->exprs_,&local_40);
  if (local_40.super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void popIndentation()
    {
        auto expr = unfinishedExpressions_.top().expression;
        expr->addExpressionFromNextIndentationLevel(unfinishedExpressions_.top().sequence);
        unfinishedExpressions_.pop();
        unfinishedExpressions_.top().sequence->addExpression(expr);
    }